

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BranchAndBound.cpp
# Opt level: O2

optional<unsigned_long> __thiscall
tsbp::TwoStepBranchingProcedure::Backtrack(TwoStepBranchingProcedure *this,size_t currentNode)

{
  uint uVar1;
  unsigned_long *puVar2;
  bool bVar3;
  _Storage<unsigned_long,_true> _Var4;
  size_t sVar5;
  ostream *poVar6;
  pointer puVar7;
  ulong uVar8;
  ulong extraout_RDX;
  undefined8 uVar9;
  __normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
  __first;
  __normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
  _Var10;
  __node_base *p_Var11;
  unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>
  *__range1;
  long lVar12;
  long lVar13;
  pair<std::__detail::_Node_iterator<unsigned_long,_true,_false>,_bool> pVar14;
  optional<unsigned_long> oVar15;
  TwoStepBranchingProcedure *local_40;
  TwoStepBranchingProcedure *local_38;
  
  CheckMemoryUsage();
  if ((this->nodesToDeactivate)._M_h._M_element_count == 0) goto LAB_00138e71;
  _Var10._M_current =
       (this->activeNodes).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl
       .super__Vector_impl_data._M_start;
  puVar2 = (this->activeNodes).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
           _M_impl.super__Vector_impl_data._M_finish;
  lVar12 = (long)puVar2 - (long)_Var10._M_current;
  local_40 = this;
  local_38 = this;
  for (lVar13 = lVar12 >> 5; 0 < lVar13; lVar13 = lVar13 + -1) {
    bVar3 = __gnu_cxx::__ops::
            _Iter_pred<tsbp::TwoStepBranchingProcedure::Backtrack(unsigned_long)::$_0>::operator()
                      ((_Iter_pred<tsbp::TwoStepBranchingProcedure::Backtrack(unsigned_long)::__0> *
                       )&local_40,_Var10);
    __first._M_current = _Var10._M_current;
    if (bVar3) goto LAB_00138e25;
    bVar3 = __gnu_cxx::__ops::
            _Iter_pred<tsbp::TwoStepBranchingProcedure::Backtrack(unsigned_long)::$_0>::operator()
                      ((_Iter_pred<tsbp::TwoStepBranchingProcedure::Backtrack(unsigned_long)::__0> *
                       )&local_40,
                       (__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                        )(_Var10._M_current + 1));
    __first._M_current = _Var10._M_current + 1;
    if (bVar3) goto LAB_00138e25;
    bVar3 = __gnu_cxx::__ops::
            _Iter_pred<tsbp::TwoStepBranchingProcedure::Backtrack(unsigned_long)::$_0>::operator()
                      ((_Iter_pred<tsbp::TwoStepBranchingProcedure::Backtrack(unsigned_long)::__0> *
                       )&local_40,
                       (__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                        )(_Var10._M_current + 2));
    __first._M_current = _Var10._M_current + 2;
    if (bVar3) goto LAB_00138e25;
    bVar3 = __gnu_cxx::__ops::
            _Iter_pred<tsbp::TwoStepBranchingProcedure::Backtrack(unsigned_long)::$_0>::operator()
                      ((_Iter_pred<tsbp::TwoStepBranchingProcedure::Backtrack(unsigned_long)::__0> *
                       )&local_40,
                       (__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                        )(_Var10._M_current + 3));
    __first._M_current = _Var10._M_current + 3;
    if (bVar3) goto LAB_00138e25;
    _Var10._M_current = _Var10._M_current + 4;
    lVar12 = lVar12 + -0x20;
  }
  lVar12 = lVar12 >> 3;
  if (lVar12 == 1) {
LAB_00138e00:
    bVar3 = __gnu_cxx::__ops::
            _Iter_pred<tsbp::TwoStepBranchingProcedure::Backtrack(unsigned_long)::$_0>::operator()
                      ((_Iter_pred<tsbp::TwoStepBranchingProcedure::Backtrack(unsigned_long)::__0> *
                       )&local_40,_Var10);
    __first._M_current = _Var10._M_current;
    if (!bVar3) {
      __first._M_current = puVar2;
    }
LAB_00138e25:
    if (__first._M_current != puVar2) {
      _Var10._M_current = __first._M_current;
      while (_Var10._M_current = _Var10._M_current + 1, _Var10._M_current != puVar2) {
        bVar3 = __gnu_cxx::__ops::
                _Iter_pred<tsbp::TwoStepBranchingProcedure::Backtrack(unsigned_long)::$_0>::
                operator()((_Iter_pred<tsbp::TwoStepBranchingProcedure::Backtrack(unsigned_long)::__0>
                            *)&local_38,_Var10);
        if (!bVar3) {
          *__first._M_current = *_Var10._M_current;
          __first._M_current = __first._M_current + 1;
        }
      }
    }
  }
  else {
    if (lVar12 == 2) {
LAB_00138deb:
      bVar3 = __gnu_cxx::__ops::
              _Iter_pred<tsbp::TwoStepBranchingProcedure::Backtrack(unsigned_long)::$_0>::operator()
                        ((_Iter_pred<tsbp::TwoStepBranchingProcedure::Backtrack(unsigned_long)::__0>
                          *)&local_40,_Var10);
      __first._M_current = _Var10._M_current;
      if (!bVar3) {
        _Var10._M_current = _Var10._M_current + 1;
        goto LAB_00138e00;
      }
      goto LAB_00138e25;
    }
    __first._M_current = puVar2;
    if (lVar12 == 3) {
      bVar3 = __gnu_cxx::__ops::
              _Iter_pred<tsbp::TwoStepBranchingProcedure::Backtrack(unsigned_long)::$_0>::operator()
                        ((_Iter_pred<tsbp::TwoStepBranchingProcedure::Backtrack(unsigned_long)::__0>
                          *)&local_40,_Var10);
      __first._M_current = _Var10._M_current;
      if (!bVar3) {
        _Var10._M_current = _Var10._M_current + 1;
        goto LAB_00138deb;
      }
      goto LAB_00138e25;
    }
  }
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::erase
            (&this->activeNodes,(const_iterator)__first._M_current,
             (const_iterator)
             (this->activeNodes).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
             _M_impl.super__Vector_impl_data._M_finish);
LAB_00138e71:
  p_Var11 = &(this->nodesToDeactivate)._M_h._M_before_begin;
  while (p_Var11 = p_Var11->_M_nxt, p_Var11 != (__node_base *)0x0) {
    if ((long)(int)*(size_type *)(p_Var11 + 1) != this->maxPlacedItemsInfeasibleNodeId) {
      std::__uniq_ptr_impl<tsbp::PackingRelaxed2D,_std::default_delete<tsbp::PackingRelaxed2D>_>::
      reset((__uniq_ptr_impl<tsbp::PackingRelaxed2D,_std::default_delete<tsbp::PackingRelaxed2D>_> *
            )&(this->tree).super_type.m_vertices.
              super__Vector_base<boost::detail::adj_list_gen<boost::adjacency_list<boost::vecS,_boost::vecS,_boost::directedS,_tsbp::TwoStepBranchingProcedure::Node,_boost::no_property,_boost::no_property,_boost::listS>,_boost::vecS,_boost::vecS,_boost::directedS,_tsbp::TwoStepBranchingProcedure::Node,_boost::no_property,_boost::no_property,_boost::listS>::config::stored_vertex,_std::allocator<boost::detail::adj_list_gen<boost::adjacency_list<boost::vecS,_boost::vecS,_boost::directedS,_tsbp::TwoStepBranchingProcedure::Node,_boost::no_property,_boost::no_property,_boost::listS>,_boost::vecS,_boost::vecS,_boost::directedS,_tsbp::TwoStepBranchingProcedure::Node,_boost::no_property,_boost::no_property,_boost::listS>::config::stored_vertex>_>
              ._M_impl.super__Vector_impl_data._M_start[(int)*(size_type *)(p_Var11 + 1)].
              super_StoredVertex.m_property.Packing,(pointer)0x0);
    }
  }
  std::
  _Hashtable<unsigned_long,_unsigned_long,_std::allocator<unsigned_long>,_std::__detail::_Identity,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
  ::clear(&(this->nodesToDeactivate)._M_h);
  pVar14 = std::
           _Hashtable<unsigned_long,unsigned_long,std::allocator<unsigned_long>,std::__detail::_Identity,std::equal_to<unsigned_long>,std::hash<unsigned_long>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
           ::_M_emplace<unsigned_long&>
                     ((_Hashtable<unsigned_long,unsigned_long,std::allocator<unsigned_long>,std::__detail::_Identity,std::equal_to<unsigned_long>,std::hash<unsigned_long>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
                       *)&this->nodesToDeactivate,&this->maxPlacedItemsInfeasibleNodeId);
  _Var4._M_value =
       (unsigned_long)pVar14.first.super__Node_iterator_base<unsigned_long,_false>._M_cur;
  puVar7 = (this->activeNodes).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
           _M_impl.super__Vector_impl_data._M_finish;
  if (puVar7 == (this->activeNodes).
                super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                super__Vector_impl_data._M_start) {
    uVar9 = 0;
  }
  else {
    sVar5 = ((long)(this->tree).super_type.m_vertices.
                   super__Vector_base<boost::detail::adj_list_gen<boost::adjacency_list<boost::vecS,_boost::vecS,_boost::directedS,_tsbp::TwoStepBranchingProcedure::Node,_boost::no_property,_boost::no_property,_boost::listS>,_boost::vecS,_boost::vecS,_boost::directedS,_tsbp::TwoStepBranchingProcedure::Node,_boost::no_property,_boost::no_property,_boost::listS>::config::stored_vertex,_std::allocator<boost::detail::adj_list_gen<boost::adjacency_list<boost::vecS,_boost::vecS,_boost::directedS,_tsbp::TwoStepBranchingProcedure::Node,_boost::no_property,_boost::no_property,_boost::listS>,_boost::vecS,_boost::vecS,_boost::directedS,_tsbp::TwoStepBranchingProcedure::Node,_boost::no_property,_boost::no_property,_boost::listS>::config::stored_vertex>_>
                   ._M_impl.super__Vector_impl_data._M_finish -
            (long)(this->tree).super_type.m_vertices.
                  super__Vector_base<boost::detail::adj_list_gen<boost::adjacency_list<boost::vecS,_boost::vecS,_boost::directedS,_tsbp::TwoStepBranchingProcedure::Node,_boost::no_property,_boost::no_property,_boost::listS>,_boost::vecS,_boost::vecS,_boost::directedS,_tsbp::TwoStepBranchingProcedure::Node,_boost::no_property,_boost::no_property,_boost::listS>::config::stored_vertex,_std::allocator<boost::detail::adj_list_gen<boost::adjacency_list<boost::vecS,_boost::vecS,_boost::directedS,_tsbp::TwoStepBranchingProcedure::Node,_boost::no_property,_boost::no_property,_boost::listS>,_boost::vecS,_boost::vecS,_boost::directedS,_tsbp::TwoStepBranchingProcedure::Node,_boost::no_property,_boost::no_property,_boost::listS>::config::stored_vertex>_>
                  ._M_impl.super__Vector_impl_data._M_start) / 0x30;
    uVar1 = (uint)this->exploredNodeDisplayCount;
    uVar8 = (ulong)uVar1;
    if (this->exploredNodeDisplayInterval < (int)((int)sVar5 - uVar1)) {
      this->exploredNodeDisplayCount = sVar5;
      poVar6 = std::operator<<((ostream *)&std::cout,
                               "TSBP \t Explored / root outedges / active nodes: ");
      poVar6 = std::ostream::_M_insert<unsigned_long>((ulong)poVar6);
      poVar6 = std::operator<<(poVar6," / ");
      poVar6 = std::ostream::_M_insert<unsigned_long>((ulong)poVar6);
      poVar6 = std::operator<<(poVar6," / ");
      poVar6 = std::ostream::_M_insert<unsigned_long>((ulong)poVar6);
      std::operator<<(poVar6,"\n");
      puVar7 = (this->activeNodes).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
               ._M_impl.super__Vector_impl_data._M_finish;
      uVar8 = extraout_RDX;
    }
    _Var4 = (_Storage<unsigned_long,_true>)
            ((_Storage<unsigned_long,_true> *)(puVar7 + -1))->_M_value;
    uVar9 = CONCAT71((int7)(uVar8 >> 8),1);
  }
  oVar15.super__Optional_base<unsigned_long,_true,_true>._M_payload.
  super__Optional_payload_base<unsigned_long>._8_8_ = uVar9;
  oVar15.super__Optional_base<unsigned_long,_true,_true>._M_payload.
  super__Optional_payload_base<unsigned_long>._M_payload._M_value = _Var4._M_value;
  return (optional<unsigned_long>)
         oVar15.super__Optional_base<unsigned_long,_true,_true>._M_payload.
         super__Optional_payload_base<unsigned_long>;
}

Assistant:

std::optional<size_t> TwoStepBranchingProcedure::Backtrack(size_t currentNode)
{
    // Check here instead of IsCancelled() to avoid excessive number of memory checks.
    // According to https://stackoverflow.com/a/64166/5587903.
    CheckMemoryUsage();

    // Remove deactivated leaves.
    if (!this->nodesToDeactivate.empty())
    {
        // Delete ordersToRemove from orders according to https://en.wikipedia.org/wiki/Erase%E2%80%93remove_idiom
        this->activeNodes.erase(
            std::remove_if(
                std::begin(this->activeNodes),
                std::end(this->activeNodes),
                [&](size_t nodeToRemove)
                {
                    return this->nodesToDeactivate.contains(nodeToRemove);
                }),
            std::end(this->activeNodes));
    }

    // Clear memory from nodes that will never be used again (fathomed/pruned? What's the terminology here?).
    for (int nodeIdToDeactivate: this->nodesToDeactivate)
    {
        Node& nodeToDeactivate = this->tree[nodeIdToDeactivate];

        if (nodeIdToDeactivate == this->maxPlacedItemsInfeasibleNodeId)
        {
            continue;
        }

        nodeToDeactivate.Packing.reset();
    }

    // TODO.Performance: is this the most efficient way to clear the set?
    ////this->nodesToDeactivate = std::unordered_set<size_t>{ this->maxPlacedItemsInfeasibleNodeId };
    this->nodesToDeactivate.clear();
    this->nodesToDeactivate.emplace(this->maxPlacedItemsInfeasibleNodeId);

    if (this->activeNodes.size() == 0)
    {
        return std::nullopt;
    }

    if ((int)this->tree.m_vertices.size() - (int)this->exploredNodeDisplayCount > (int)this->exploredNodeDisplayInterval)
    {
        this->exploredNodeDisplayCount = this->tree.m_vertices.size();
        size_t outDegree = boost::out_degree(0, this->tree);

        std::cout << "TSBP \t Explored / root outedges / active nodes: " << this->tree.m_vertices.size() << " / " << outDegree << " / " << this->activeNodes.size() << "\n";
    }

    // Backtrack
    return this->activeNodes.back();
}